

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_union_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  bool bVar9;
  flatbuffers_uoffset_t base;
  flatcc_union_verifier_descriptor_t ud;
  uint local_54;
  flatcc_union_verifier_descriptor_t local_50;
  
  uVar8 = id * 2 + 2;
  uVar2 = td->vsize;
  if (uVar8 < uVar2) {
    uVar6 = *(ushort *)((long)td->vtable + (ulong)uVar8);
  }
  else {
    uVar6 = 0;
  }
  if (uVar6 == 0) {
    uVar8 = id * 2 + 4;
    if (((uVar2 <= uVar8) || (iVar5 = 0x17, *(short *)((long)td->vtable + (ulong)uVar8) == 0)) &&
       (iVar5 = 0x15, required == 0)) {
      iVar5 = 0;
    }
  }
  else {
    if (uVar8 < uVar2) {
      uVar7 = *(ushort *)((long)td->vtable + (ulong)uVar8);
    }
    else {
      uVar7 = 0;
    }
    pvVar4 = td->buf;
    if ((uVar7 == 0) || (uVar7 < td->tsize)) {
      uVar8 = id * 2 + 4;
      bVar9 = true;
      if (uVar8 < uVar2) {
        bVar9 = *(short *)((long)td->vtable + (ulong)uVar8) == 0;
      }
      uVar3 = td->table;
      cVar1 = *(char *)((long)pvVar4 + (ulong)uVar6 + (ulong)uVar3);
      if ((cVar1 != '\0') || (iVar5 = 0x18, bVar9)) {
        if (cVar1 == '\0') {
          iVar5 = 0;
        }
        else {
          iVar5 = get_offset_field(td,id,required,&local_54);
          if (local_54 != 0 && iVar5 == 0) {
            local_50.end = td->end;
            local_50.ttl = td->ttl;
            local_50.base = local_54;
            local_50.offset = *(flatbuffers_uoffset_t *)((long)pvVar4 + (ulong)local_54);
            local_50.type = *(flatbuffers_utype_t *)((long)pvVar4 + (ulong)uVar6 + (ulong)uVar3);
            local_50.buf = pvVar4;
            iVar5 = (*uvf)(&local_50);
          }
        }
      }
    }
    else {
      uVar6 = 0;
      if (uVar8 < uVar2) {
        uVar6 = *(ushort *)((long)td->vtable + (ulong)uVar8);
      }
      iVar5 = 0;
      if (uVar6 != 0) {
        iVar5 = 0xd;
        if (uVar6 < td->tsize) {
          iVar5 = 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int flatcc_verify_union_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uint8_t *type;
    uoffset_t base;
    flatcc_union_verifier_descriptor_t ud;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        vte_table = read_vt_entry(td, id);
        verify(vte_table == 0, flatcc_verify_error_union_cannot_have_a_table_without_a_type);
        verify(!required, flatcc_verify_error_type_field_absent_from_required_union_field);
        return flatcc_verify_ok;
    }
    /* No need to check required here. */
    check_result(verify_field(td, id - 1, 0, 1, 1));
    /* Only now is it safe to read the type. */
    vte_table = read_vt_entry(td, id);
    type = (const uint8_t *)td->buf + td->table + vte_type;
    verify(*type || vte_table == 0, flatcc_verify_error_union_type_NONE_cannot_have_a_value);

    if (*type == 0) {
        return flatcc_verify_ok;
    }
    check_field(td, id, required, base);
    ud.buf = td->buf;
    ud.end = td->end;
    ud.ttl = td->ttl;
    ud.base = base;
    ud.offset = read_uoffset(td->buf, base);
    ud.type = *type;
    return uvf(&ud);
}